

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_property.c
# Opt level: O2

void mpt_text_init(mpt_text *tx,mpt_text *from)

{
  char *pcVar1;
  mpt_fpoint mVar2;
  uint8_t uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char *pcVar7;
  
  if (from == (mpt_text *)0x0) {
    tx->angle = 0.0;
    (tx->color).alpha = 0xff;
    (tx->color).red = '\0';
    (tx->color).green = '\0';
    (tx->color).blue = '\0';
    tx->size = '\n';
    tx->weight = 'n';
    tx->style = 'n';
    tx->align = '5';
    (tx->pos).x = 0.5;
    (tx->pos).y = 0.5;
    tx->_value = (char *)0x0;
    tx->_font = (char *)0x0;
  }
  else {
    tx->angle = from->angle;
    pcVar7 = from->_value;
    pcVar1 = from->_font;
    uVar3 = from->size;
    cVar4 = from->weight;
    cVar5 = from->style;
    cVar6 = from->align;
    mVar2 = from->pos;
    tx->color = from->color;
    tx->size = uVar3;
    tx->weight = cVar4;
    tx->style = cVar5;
    tx->align = cVar6;
    tx->pos = mVar2;
    tx->_value = pcVar7;
    tx->_font = pcVar1;
    if (from->_font != (char *)0x0) {
      pcVar7 = strdup(from->_font);
      tx->_font = pcVar7;
    }
    if (from->_value != (char *)0x0) {
      pcVar7 = strdup(from->_value);
      tx->_value = pcVar7;
    }
  }
  return;
}

Assistant:

extern void mpt_text_init(MPT_STRUCT(text) *tx, const MPT_STRUCT(text) *from)
{
	if (from) {
		*tx = *from;
		
		if (from->_font) tx->_font = strdup(from->_font);
		if (from->_value) tx->_value = strdup(from->_value);
		
		return;
	}
	*tx = def_text;
}